

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
nonius::detail::estimate_clock_cost<std::chrono::_V2::system_clock>
          (environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,FloatDuration<std::chrono::_V2::system_clock> resolution)

{
  TimingOf<std::chrono::_V2::system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&(run_for_at_least_argument_t<system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&>)>
  *pTVar1;
  double dVar2;
  anon_class_16_2_7d74a361 __gen;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last;
  anon_class_1_0_00000001_for_time_clock *in_R9;
  undefined8 uStack_98;
  anon_class_1_0_00000001_for_time_clock time_clock;
  vector<double,_std::allocator<double>_> times;
  __node_base_ptr ap_Stack_58 [2];
  outlier_classification local_48;
  TimingOf<std::chrono::_V2::system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&(run_for_at_least_argument_t<system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&>)>
  local_30;
  
  estimate_clock_cost<std::chrono::_V2::system_clock>::anon_class_16_2_7d74a361::
  anon_class_1_0_00000001_for_time_clock::operator()(&time_clock,1);
  times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)ap_Stack_58;
  times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x1;
  times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ap_Stack_58[0] = (__node_base_ptr)0x0;
  last._M_current = (double *)0x2710;
  run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::estimate_clock_cost<std::chrono::_V2::system_clock>(std::chrono::duration<double,std::chrono::_V2::system_clock::period>)::_lambda(int)_1_&>
            (&local_30,(detail *)&times,(parameters *)0x989680,
             (Duration<std::chrono::_V2::system_clock>)0x2710,(int)&time_clock,in_R9);
  pTVar1 = (TimingOf<std::chrono::_V2::system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&(run_for_at_least_argument_t<system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&>)>
            *)(resolution.__r * 100000.0);
  if (1000000000.0 <= (double)pTVar1) {
    pTVar1 = (TimingOf<std::chrono::_V2::system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&(run_for_at_least_argument_t<system_clock,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2213:31)_&>)>
              *)0x41cdcd6500000000;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&times);
  times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  times.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dVar2 = ceil((double)pTVar1 / (double)local_30.elapsed.__r);
  std::vector<double,_std::allocator<double>_>::reserve(&times,(long)(int)dVar2);
  __gen.r = pTVar1;
  __gen._0_8_ = uStack_98;
  std::
  generate_n<std::back_insert_iterator<std::vector<double,std::allocator<double>>>,int,nonius::detail::estimate_clock_cost<std::chrono::_V2::system_clock>(std::chrono::duration<double,std::chrono::_V2::system_clock::period>)::_lambda()_1_>
            (&times,(int)dVar2,__gen);
  dVar2 = mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (&local_48,
             (detail *)
             times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish,last);
  (__return_storage_ptr__->outliers).high_severe = local_48.high_severe;
  (__return_storage_ptr__->outliers).samples_seen = local_48.samples_seen;
  (__return_storage_ptr__->outliers).low_severe = local_48.low_severe;
  (__return_storage_ptr__->outliers).low_mild = local_48.low_mild;
  (__return_storage_ptr__->outliers).high_mild = local_48.high_mild;
  (__return_storage_ptr__->mean).__r = dVar2;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&times.super__Vector_base<double,_std::allocator<double>_>);
  return __return_storage_ptr__;
}

Assistant:

environment_estimate<FloatDuration<Clock>> estimate_clock_cost(FloatDuration<Clock> resolution) {
            auto time_limit = std::min(resolution * clock_cost_estimation_tick_limit, FloatDuration<Clock>(clock_cost_estimation_time_limit));
            auto time_clock = [](int k) {
                return detail::measure<Clock>([k]{
                    for(int i = 0; i < k; ++i) {
                        volatile auto ignored = Clock::now();
                        (void)ignored;
                    }
                }).elapsed;
            };
            time_clock(1);
            int iters = clock_cost_estimation_iterations;
            auto&& r = run_for_at_least<Clock>({}, chrono::duration_cast<Duration<Clock>>(clock_cost_estimation_time), iters, time_clock);
            std::vector<double> times;
            int nsamples = static_cast<int>(std::ceil(time_limit / r.elapsed));
            times.reserve(nsamples);
            std::generate_n(std::back_inserter(times), nsamples, [time_clock, &r]{
                        return (time_clock(r.iterations) / r.iterations).count();
                    });
            return {
                FloatDuration<Clock>(mean(times.begin(), times.end())),
                classify_outliers(times.begin(), times.end()),
            };
        }